

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint8_avx2.h
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::ObjectIntersectorK<8,_false>_>,_false>
     ::occludedCoherent(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  ulong *puVar1;
  AccelData *pAVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  uint uVar14;
  undefined4 uVar15;
  RTCIntersectFunctionN p_Var16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  ulong *puVar26;
  ulong *puVar27;
  ulong uVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [64];
  vint4 ai_1;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  vint4 ai;
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 in_ZMM11 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  vint8 bi_1;
  vint<8> octant;
  vint<8> mask;
  StackItemMaskT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_13a0 [32];
  RTCIntersectFunctionNArguments local_1368;
  Geometry *local_1338;
  undefined8 local_1330;
  RTCIntersectArguments *local_1328;
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  uint local_12d0;
  uint uStack_12cc;
  uint uStack_12c8;
  uint uStack_12c4;
  undefined4 local_12c0;
  undefined4 uStack_12bc;
  undefined4 uStack_12b8;
  undefined4 uStack_12b4;
  undefined4 local_12b0;
  undefined4 uStack_12ac;
  undefined4 uStack_12a8;
  undefined4 uStack_12a4;
  undefined1 local_12a0 [16];
  undefined1 local_1290 [16];
  undefined1 local_1280 [16];
  undefined1 local_1270 [16];
  uint local_1260;
  uint uStack_125c;
  uint uStack_1258;
  uint uStack_1254;
  float local_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  uint local_1240;
  uint uStack_123c;
  uint uStack_1238;
  uint uStack_1234;
  undefined1 local_1230 [16];
  undefined1 local_1220 [16];
  undefined1 local_1210 [16];
  uint local_1200;
  uint uStack_11fc;
  uint uStack_11f8;
  uint uStack_11f4;
  float local_11f0;
  float fStack_11ec;
  float fStack_11e8;
  float fStack_11e4;
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  float local_11a0;
  float fStack_119c;
  float fStack_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  uint uStack_1184;
  float local_1180;
  float fStack_117c;
  float fStack_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  uint uStack_1164;
  undefined1 local_1160 [32];
  anon_union_32_3_898e2e57_for_vint_impl<8>_1 local_1140;
  undefined4 local_1120;
  undefined4 uStack_111c;
  undefined4 uStack_1118;
  undefined4 uStack_1114;
  undefined4 uStack_1110;
  undefined4 uStack_110c;
  undefined4 uStack_1108;
  undefined4 uStack_1104;
  undefined1 local_1100 [32];
  float local_10e0;
  float fStack_10dc;
  float fStack_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float fStack_10c8;
  uint uStack_10c4;
  float local_10c0;
  float fStack_10bc;
  float fStack_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float fStack_10a8;
  uint uStack_10a4;
  float local_10a0;
  float fStack_109c;
  float fStack_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float fStack_1088;
  uint uStack_1084;
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  float local_fe0;
  float fStack_fdc;
  float fStack_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float fStack_fc8;
  uint uStack_fc4;
  undefined1 local_fc0 [32];
  ulong local_fa0;
  Geometry *local_f98;
  ulong local_f90 [492];
  undefined1 auVar59 [64];
  
  local_13a0 = vpcmpeqd_avx2(in_ZMM11._0_32_,in_ZMM11._0_32_);
  auVar53 = ZEXT3264(local_13a0);
  auVar33 = vpcmpeqd_avx2(local_13a0,(undefined1  [32])valid_i->field_0);
  uVar14 = vmovmskps_avx(auVar33);
  if (uVar14 == 0) {
    return;
  }
  local_1140.v = valid_i->field_0;
  pAVar2 = This->ptr;
  uVar18 = (ulong)(uVar14 & 0xff);
  auVar35 = *(undefined1 (*) [32])(ray + 0x80);
  auVar44._8_4_ = 0x7fffffff;
  auVar44._0_8_ = 0x7fffffff7fffffff;
  auVar44._12_4_ = 0x7fffffff;
  auVar44._16_4_ = 0x7fffffff;
  auVar44._20_4_ = 0x7fffffff;
  auVar44._24_4_ = 0x7fffffff;
  auVar44._28_4_ = 0x7fffffff;
  auVar36 = vandps_avx(auVar35,auVar44);
  auVar46._8_4_ = 0x219392ef;
  auVar46._0_8_ = 0x219392ef219392ef;
  auVar46._12_4_ = 0x219392ef;
  auVar46._16_4_ = 0x219392ef;
  auVar46._20_4_ = 0x219392ef;
  auVar46._24_4_ = 0x219392ef;
  auVar46._28_4_ = 0x219392ef;
  auVar36 = vcmpps_avx(auVar36,auVar46,1);
  auVar58 = vblendvps_avx(auVar35,auVar46,auVar36);
  auVar36 = *(undefined1 (*) [32])(ray + 0xa0);
  auVar3 = vandps_avx(auVar36,auVar44);
  auVar3 = vcmpps_avx(auVar3,auVar46,1);
  auVar4 = vblendvps_avx(auVar36,auVar46,auVar3);
  auVar3 = *(undefined1 (*) [32])(ray + 0xc0);
  auVar41 = vandps_avx(auVar3,auVar44);
  auVar41 = vcmpps_avx(auVar41,auVar46,1);
  auVar41 = vblendvps_avx(auVar3,auVar46,auVar41);
  auVar44 = vrcpps_avx(auVar58);
  auVar48._8_4_ = 0x3f800000;
  auVar48._0_8_ = 0x3f8000003f800000;
  auVar48._12_4_ = 0x3f800000;
  auVar48._16_4_ = 0x3f800000;
  auVar48._20_4_ = 0x3f800000;
  auVar48._24_4_ = 0x3f800000;
  auVar48._28_4_ = 0x3f800000;
  auVar8 = vfnmadd213ps_fma(auVar58,auVar44,auVar48);
  auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar44,auVar44);
  auVar54 = ZEXT1664(auVar8);
  auVar58 = vrcpps_avx(auVar4);
  auVar9 = vfnmadd213ps_fma(auVar4,auVar58,auVar48);
  auVar4 = vrcpps_avx(auVar41);
  auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar58,auVar58);
  auVar55 = ZEXT1664(auVar9);
  auVar10 = vfnmadd213ps_fma(auVar41,auVar4,auVar48);
  auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar4,auVar4);
  auVar56 = ZEXT1664(auVar10);
  auVar57 = ZEXT816(0) << 0x40;
  auVar59 = ZEXT1664(auVar57);
  local_11e0 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),ZEXT1632(auVar57));
  local_1100 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar57));
  local_13a0 = local_13a0 ^ auVar33;
  auVar58 = ZEXT1632(auVar57);
  auVar33 = vcmpps_avx(auVar35,auVar58,1);
  auVar35._8_4_ = 1;
  auVar35._0_8_ = 0x100000001;
  auVar35._12_4_ = 1;
  auVar35._16_4_ = 1;
  auVar35._20_4_ = 1;
  auVar35._24_4_ = 1;
  auVar35._28_4_ = 1;
  auVar33 = vandps_avx(auVar33,auVar35);
  auVar35 = vcmpps_avx(auVar36,auVar58,1);
  auVar41._8_4_ = 2;
  auVar41._0_8_ = 0x200000002;
  auVar41._12_4_ = 2;
  auVar41._16_4_ = 2;
  auVar41._20_4_ = 2;
  auVar41._24_4_ = 2;
  auVar41._28_4_ = 2;
  auVar35 = vandps_avx(auVar35,auVar41);
  auVar35 = vorps_avx(auVar35,auVar33);
  auVar36._8_4_ = 4;
  auVar36._0_8_ = 0x400000004;
  auVar36._12_4_ = 4;
  auVar36._16_4_ = 4;
  auVar36._20_4_ = 4;
  auVar36._24_4_ = 4;
  auVar36._28_4_ = 4;
  auVar33 = vcmpps_avx(auVar3,auVar58,1);
  auVar33 = vandps_avx(auVar33,auVar36);
  auVar33 = vpor_avx2(local_13a0,auVar33);
  local_1160 = vpor_avx2(auVar33,auVar35);
  local_10a0 = *(float *)ray;
  fStack_109c = *(float *)(ray + 4);
  fStack_1098 = *(float *)(ray + 8);
  fStack_1094 = *(float *)(ray + 0xc);
  fStack_1090 = *(float *)(ray + 0x10);
  fStack_108c = *(float *)(ray + 0x14);
  fStack_1088 = *(float *)(ray + 0x18);
  uStack_1084 = *(uint *)(ray + 0x1c);
  uStack_1164 = *(uint *)(ray + 0x1c) ^ 0x80000000;
  local_1180 = auVar8._0_4_ * -*(float *)ray;
  fStack_117c = auVar8._4_4_ * -*(float *)(ray + 4);
  fStack_1178 = auVar8._8_4_ * -*(float *)(ray + 8);
  fStack_1174 = auVar8._12_4_ * -*(float *)(ray + 0xc);
  fStack_1170 = -*(float *)(ray + 0x10) * 0.0;
  fStack_116c = -*(float *)(ray + 0x14) * 0.0;
  fStack_1168 = -*(float *)(ray + 0x18) * 0.0;
  local_10c0 = *(float *)(ray + 0x20);
  fStack_10bc = *(float *)(ray + 0x24);
  fStack_10b8 = *(float *)(ray + 0x28);
  fStack_10b4 = *(float *)(ray + 0x2c);
  fStack_10b0 = *(float *)(ray + 0x30);
  fStack_10ac = *(float *)(ray + 0x34);
  fStack_10a8 = *(float *)(ray + 0x38);
  uStack_10a4 = *(uint *)(ray + 0x3c);
  uStack_1184 = *(uint *)(ray + 0x3c) ^ 0x80000000;
  local_11a0 = auVar9._0_4_ * -*(float *)(ray + 0x20);
  fStack_119c = auVar9._4_4_ * -*(float *)(ray + 0x24);
  fStack_1198 = auVar9._8_4_ * -*(float *)(ray + 0x28);
  fStack_1194 = auVar9._12_4_ * -*(float *)(ray + 0x2c);
  fStack_1190 = -*(float *)(ray + 0x30) * 0.0;
  fStack_118c = -*(float *)(ray + 0x34) * 0.0;
  fStack_1188 = -*(float *)(ray + 0x38) * 0.0;
  local_10e0 = *(float *)(ray + 0x40);
  fStack_10dc = *(float *)(ray + 0x44);
  fStack_10d8 = *(float *)(ray + 0x48);
  fStack_10d4 = *(float *)(ray + 0x4c);
  fStack_10d0 = *(float *)(ray + 0x50);
  fStack_10cc = *(float *)(ray + 0x54);
  fStack_10c8 = *(float *)(ray + 0x58);
  uStack_10c4 = *(uint *)(ray + 0x5c);
  local_1000 = mm_lookupmask_ps._16_8_;
  uStack_ff8 = mm_lookupmask_ps._24_8_;
  uStack_ff0 = mm_lookupmask_ps._16_8_;
  uStack_fe8 = mm_lookupmask_ps._24_8_;
  local_fe0 = auVar10._0_4_ * -*(float *)(ray + 0x40);
  fStack_fdc = auVar10._4_4_ * -*(float *)(ray + 0x44);
  fStack_fd8 = auVar10._8_4_ * -*(float *)(ray + 0x48);
  fStack_fd4 = auVar10._12_4_ * -*(float *)(ray + 0x4c);
  fStack_fd0 = -*(float *)(ray + 0x50) * 0.0;
  fStack_fcc = -*(float *)(ray + 0x54) * 0.0;
  fStack_fc8 = -*(float *)(ray + 0x58) * 0.0;
  uStack_fc4 = *(uint *)(ray + 0x5c) ^ 0x80000000;
  local_12d0 = 0x80000000;
  uStack_12cc = 0x80000000;
  uStack_12c8 = 0x80000000;
  uStack_12c4 = 0x80000000;
  local_1120 = 0x7f800000;
  uStack_111c = 0x7f800000;
  uStack_1118 = 0x7f800000;
  uStack_1114 = 0x7f800000;
  uStack_1110 = 0x7f800000;
  uStack_110c = 0x7f800000;
  uStack_1108 = 0x7f800000;
  uStack_1104 = 0x7f800000;
  local_1040 = ZEXT1632(auVar8);
  local_1060 = ZEXT1632(auVar9);
  local_1080 = ZEXT1632(auVar10);
LAB_0161cf81:
  lVar23 = 0;
  for (uVar17 = uVar18; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
    lVar23 = lVar23 + 1;
  }
  uVar15 = *(undefined4 *)(local_1160 + lVar23 * 4);
  auVar29._4_4_ = uVar15;
  auVar29._0_4_ = uVar15;
  auVar29._8_4_ = uVar15;
  auVar29._12_4_ = uVar15;
  auVar29._16_4_ = uVar15;
  auVar29._20_4_ = uVar15;
  auVar29._24_4_ = uVar15;
  auVar29._28_4_ = uVar15;
  local_11c0 = vpcmpeqd_avx2(auVar29,local_1160);
  uVar15 = vmovmskps_avx(local_11c0);
  local_1338 = (Geometry *)CONCAT44((int)((ulong)lVar23 >> 0x20),uVar15);
  auVar12._4_4_ = fStack_109c;
  auVar12._0_4_ = local_10a0;
  auVar12._8_4_ = fStack_1098;
  auVar12._12_4_ = fStack_1094;
  auVar12._16_4_ = fStack_1090;
  auVar12._20_4_ = fStack_108c;
  auVar12._24_4_ = fStack_1088;
  auVar12._28_4_ = uStack_1084;
  auVar49._8_4_ = 0x7f800000;
  auVar49._0_8_ = 0x7f8000007f800000;
  auVar49._12_4_ = 0x7f800000;
  auVar49._16_4_ = 0x7f800000;
  auVar49._20_4_ = 0x7f800000;
  auVar49._24_4_ = 0x7f800000;
  auVar49._28_4_ = 0x7f800000;
  auVar33 = vblendvps_avx(auVar49,auVar12,local_11c0);
  uVar18 = ~(ulong)local_1338 & uVar18;
  auVar35 = vshufps_avx(auVar33,auVar33,0xb1);
  auVar33 = vminps_avx(auVar33,auVar35);
  auVar35 = vshufpd_avx(auVar33,auVar33,5);
  auVar35 = vminps_avx(auVar33,auVar35);
  auVar4._4_4_ = fStack_10bc;
  auVar4._0_4_ = local_10c0;
  auVar4._8_4_ = fStack_10b8;
  auVar4._12_4_ = fStack_10b4;
  auVar4._16_4_ = fStack_10b0;
  auVar4._20_4_ = fStack_10ac;
  auVar4._24_4_ = fStack_10a8;
  auVar4._28_4_ = uStack_10a4;
  auVar33 = vblendvps_avx(auVar49,auVar4,local_11c0);
  auVar8 = vminps_avx(auVar35._0_16_,auVar35._16_16_);
  auVar35 = vshufps_avx(auVar33,auVar33,0xb1);
  auVar33 = vminps_avx(auVar33,auVar35);
  auVar35 = vshufpd_avx(auVar33,auVar33,5);
  auVar33 = vminps_avx(auVar33,auVar35);
  auVar9 = vminps_avx(auVar33._0_16_,auVar33._16_16_);
  auVar9 = vunpcklps_avx(auVar8,auVar9);
  auVar58._4_4_ = fStack_10dc;
  auVar58._0_4_ = local_10e0;
  auVar58._8_4_ = fStack_10d8;
  auVar58._12_4_ = fStack_10d4;
  auVar58._16_4_ = fStack_10d0;
  auVar58._20_4_ = fStack_10cc;
  auVar58._24_4_ = fStack_10c8;
  auVar58._28_4_ = uStack_10c4;
  auVar33 = vblendvps_avx(auVar49,auVar58,local_11c0);
  auVar35 = vshufps_avx(auVar33,auVar33,0xb1);
  auVar33 = vminps_avx(auVar33,auVar35);
  auVar35 = vshufpd_avx(auVar33,auVar33,5);
  auVar33 = vminps_avx(auVar33,auVar35);
  auVar8 = vminps_avx(auVar33._0_16_,auVar33._16_16_);
  auVar10 = vinsertps_avx(auVar9,auVar8,0x28);
  auVar50._8_4_ = 0xff800000;
  auVar50._0_8_ = 0xff800000ff800000;
  auVar50._12_4_ = 0xff800000;
  auVar50._16_4_ = 0xff800000;
  auVar50._20_4_ = 0xff800000;
  auVar50._24_4_ = 0xff800000;
  auVar50._28_4_ = 0xff800000;
  auVar33 = vblendvps_avx(auVar50,auVar12,local_11c0);
  auVar35 = vshufps_avx(auVar33,auVar33,0xb1);
  auVar33 = vmaxps_avx(auVar33,auVar35);
  auVar35 = vshufpd_avx(auVar33,auVar33,5);
  auVar33 = vmaxps_avx(auVar33,auVar35);
  auVar8 = vmaxps_avx(auVar33._0_16_,auVar33._16_16_);
  auVar33 = vblendvps_avx(auVar50,auVar4,local_11c0);
  auVar35 = vshufps_avx(auVar33,auVar33,0xb1);
  auVar33 = vmaxps_avx(auVar33,auVar35);
  auVar35 = vshufpd_avx(auVar33,auVar33,5);
  auVar33 = vmaxps_avx(auVar33,auVar35);
  auVar9 = vmaxps_avx(auVar33._0_16_,auVar33._16_16_);
  auVar9 = vunpcklps_avx(auVar8,auVar9);
  auVar33 = vblendvps_avx(auVar50,auVar58,local_11c0);
  auVar35 = vshufps_avx(auVar33,auVar33,0xb1);
  auVar33 = vmaxps_avx(auVar33,auVar35);
  auVar35 = vshufpd_avx(auVar33,auVar33,5);
  auVar33 = vmaxps_avx(auVar33,auVar35);
  auVar8 = vmaxps_avx(auVar33._0_16_,auVar33._16_16_);
  auVar33 = vblendvps_avx(auVar49,auVar54._0_32_,local_11c0);
  auVar6 = vinsertps_avx(auVar9,auVar8,0x28);
  auVar35 = vshufps_avx(auVar33,auVar33,0xb1);
  auVar33 = vminps_avx(auVar33,auVar35);
  auVar35 = vshufpd_avx(auVar33,auVar33,5);
  auVar35 = vminps_avx(auVar33,auVar35);
  auVar33 = vblendvps_avx(auVar49,auVar55._0_32_,local_11c0);
  auVar8 = vminps_avx(auVar35._0_16_,auVar35._16_16_);
  auVar35 = vshufps_avx(auVar33,auVar33,0xb1);
  auVar33 = vminps_avx(auVar33,auVar35);
  auVar35 = vshufpd_avx(auVar33,auVar33,5);
  auVar33 = vminps_avx(auVar33,auVar35);
  auVar9 = vminps_avx(auVar33._0_16_,auVar33._16_16_);
  auVar9 = vunpcklps_avx(auVar8,auVar9);
  auVar33 = vblendvps_avx(auVar49,auVar56._0_32_,local_11c0);
  auVar35 = vshufps_avx(auVar33,auVar33,0xb1);
  auVar33 = vminps_avx(auVar33,auVar35);
  auVar35 = vshufpd_avx(auVar33,auVar33,5);
  auVar33 = vminps_avx(auVar33,auVar35);
  auVar8 = vminps_avx(auVar33._0_16_,auVar33._16_16_);
  auVar39 = vinsertps_avx(auVar9,auVar8,0x28);
  auVar33 = vblendvps_avx(auVar50,auVar54._0_32_,local_11c0);
  auVar35 = vshufps_avx(auVar33,auVar33,0xb1);
  auVar33 = vmaxps_avx(auVar33,auVar35);
  auVar35 = vshufpd_avx(auVar33,auVar33,5);
  auVar33 = vmaxps_avx(auVar33,auVar35);
  auVar8 = vmaxps_avx(auVar33._0_16_,auVar33._16_16_);
  auVar33 = vblendvps_avx(auVar50,auVar55._0_32_,local_11c0);
  auVar35 = vshufps_avx(auVar33,auVar33,0xb1);
  auVar33 = vmaxps_avx(auVar33,auVar35);
  auVar35 = vshufpd_avx(auVar33,auVar33,5);
  auVar33 = vmaxps_avx(auVar33,auVar35);
  auVar9 = vmaxps_avx(auVar33._0_16_,auVar33._16_16_);
  auVar9 = vunpcklps_avx(auVar8,auVar9);
  auVar33 = vblendvps_avx(auVar50,auVar56._0_32_,local_11c0);
  auVar35 = vshufps_avx(auVar33,auVar33,0xb1);
  auVar33 = vmaxps_avx(auVar33,auVar35);
  auVar35 = vshufpd_avx(auVar33,auVar33,5);
  auVar33 = vmaxps_avx(auVar33,auVar35);
  auVar8 = vmaxps_avx(auVar33._0_16_,auVar33._16_16_);
  auVar33 = vblendvps_avx(auVar49,local_11e0,local_11c0);
  auVar43 = vinsertps_avx(auVar9,auVar8,0x28);
  auVar35 = vshufps_avx(auVar33,auVar33,0xb1);
  auVar33 = vminps_avx(auVar33,auVar35);
  auVar35 = vshufpd_avx(auVar33,auVar33,5);
  auVar35 = vminps_avx(auVar33,auVar35);
  local_1300 = vblendvps_avx(auVar50,local_1100,local_11c0);
  auVar33 = vshufps_avx(local_1300,local_1300,0xb1);
  auVar33 = vmaxps_avx(local_1300,auVar33);
  auVar36 = vshufpd_avx(auVar33,auVar33,5);
  auVar57 = vcmpps_avx(auVar39,_DAT_01f45a50,5);
  auVar8 = vblendvps_avx(auVar43,auVar39,auVar57);
  auVar9 = vblendvps_avx(auVar10,auVar6,auVar57);
  auVar33 = vmaxps_avx(auVar33,auVar36);
  auVar10 = vblendvps_avx(auVar6,auVar10,auVar57);
  local_11f0 = auVar8._0_4_;
  auVar6 = vmovshdup_avx(auVar8);
  uVar21 = (ulong)(auVar6._0_4_ < 0.0) << 4 | 0x20;
  auVar6 = vshufpd_avx(auVar8,auVar8,1);
  uVar25 = (ulong)(auVar6._0_4_ < 0.0) << 4 | 0x40;
  auVar7 = vminps_avx(auVar35._0_16_,auVar35._16_16_);
  auVar6 = vmaxps_avx(auVar33._0_16_,auVar33._16_16_);
  auVar57 = vblendvps_avx(auVar39,auVar43,auVar57);
  auVar43._0_4_ = auVar9._0_4_ * local_11f0;
  auVar43._4_4_ = auVar9._4_4_ * auVar8._4_4_;
  auVar43._8_4_ = auVar9._8_4_ * auVar8._8_4_;
  auVar43._12_4_ = auVar9._12_4_ * auVar8._12_4_;
  local_1250 = auVar57._0_4_;
  auVar39._0_4_ = auVar10._0_4_ * local_1250;
  auVar39._4_4_ = auVar10._4_4_ * auVar57._4_4_;
  auVar39._8_4_ = auVar10._8_4_ * auVar57._8_4_;
  auVar39._12_4_ = auVar10._12_4_ * auVar57._12_4_;
  uVar17 = (ulong)(local_11f0 < 0.0) * 0x10;
  local_fa0 = *(ulong *)&pAVar2[1].bounds.bounds0.lower.field_0;
  local_f98 = local_1338;
  local_1200 = (uint)auVar43._0_4_ ^ local_12d0;
  uStack_11fc = (uint)auVar43._0_4_ ^ uStack_12cc;
  uStack_11f8 = (uint)auVar43._0_4_ ^ uStack_12c8;
  uStack_11f4 = (uint)auVar43._0_4_ ^ uStack_12c4;
  local_1210 = vshufps_avx(auVar8,auVar8,0x55);
  auVar9 = vshufps_avx(auVar43,auVar43,0x55);
  local_1220._0_4_ = auVar9._0_4_ ^ local_12d0;
  local_1220._4_4_ = auVar9._4_4_ ^ uStack_12cc;
  local_1220._8_4_ = auVar9._8_4_ ^ uStack_12c8;
  local_1220._12_4_ = auVar9._12_4_ ^ uStack_12c4;
  local_1230 = vshufps_avx(auVar8,auVar8,0xaa);
  auVar8 = vshufps_avx(auVar43,auVar43,0xaa);
  local_1240 = auVar8._0_4_ ^ local_12d0;
  uStack_123c = auVar8._4_4_ ^ uStack_12cc;
  uStack_1238 = auVar8._8_4_ ^ uStack_12c8;
  uStack_1234 = auVar8._12_4_ ^ uStack_12c4;
  local_1260 = (uint)auVar39._0_4_ ^ local_12d0;
  uStack_125c = (uint)auVar39._0_4_ ^ uStack_12cc;
  uStack_1258 = (uint)auVar39._0_4_ ^ uStack_12c8;
  uStack_1254 = (uint)auVar39._0_4_ ^ uStack_12c4;
  local_1270 = vshufps_avx(auVar57,auVar57,0x55);
  auVar8 = vshufps_avx(auVar39,auVar39,0x55);
  local_1280._0_4_ = auVar8._0_4_ ^ local_12d0;
  local_1280._4_4_ = auVar8._4_4_ ^ uStack_12cc;
  local_1280._8_4_ = auVar8._8_4_ ^ uStack_12c8;
  local_1280._12_4_ = auVar8._12_4_ ^ uStack_12c4;
  local_1290 = vshufps_avx(auVar57,auVar57,0xaa);
  auVar8 = vshufps_avx(auVar39,auVar39,0xaa);
  local_12a0._0_4_ = auVar8._0_4_ ^ local_12d0;
  local_12a0._4_4_ = auVar8._4_4_ ^ uStack_12cc;
  local_12a0._8_4_ = auVar8._8_4_ ^ uStack_12c8;
  local_12a0._12_4_ = auVar8._12_4_ ^ uStack_12c4;
  local_12b0 = auVar7._0_4_;
  local_12c0 = auVar6._0_4_;
  puVar27 = local_f90;
  auVar3._4_4_ = uStack_111c;
  auVar3._0_4_ = local_1120;
  auVar3._8_4_ = uStack_1118;
  auVar3._12_4_ = uStack_1114;
  auVar3._16_4_ = uStack_1110;
  auVar3._20_4_ = uStack_110c;
  auVar3._24_4_ = uStack_1108;
  auVar3._28_4_ = uStack_1104;
  auVar33 = vblendvps_avx(auVar3,local_11e0,local_11c0);
  auVar51 = ZEXT3264(CONCAT428(uStack_1164,
                               CONCAT424(fStack_1168,
                                         CONCAT420(fStack_116c,
                                                   CONCAT416(fStack_1170,
                                                             CONCAT412(fStack_1174,
                                                                       CONCAT48(fStack_1178,
                                                                                CONCAT44(fStack_117c
                                                                                         ,local_1180
                                                                                        ))))))));
  auVar52 = ZEXT3264(CONCAT428(uStack_1184,
                               CONCAT424(fStack_1188,
                                         CONCAT420(fStack_118c,
                                                   CONCAT416(fStack_1190,
                                                             CONCAT412(fStack_1194,
                                                                       CONCAT48(fStack_1198,
                                                                                CONCAT44(fStack_119c
                                                                                         ,local_11a0
                                                                                        ))))))));
  local_1320 = auVar33;
  uStack_12bc = local_12c0;
  uStack_12b8 = local_12c0;
  uStack_12b4 = local_12c0;
  uStack_12ac = local_12b0;
  uStack_12a8 = local_12b0;
  uStack_12a4 = local_12b0;
  fStack_124c = local_1250;
  fStack_1248 = local_1250;
  fStack_1244 = local_1250;
  fStack_11ec = local_11f0;
  fStack_11e8 = local_11f0;
  fStack_11e4 = local_11f0;
LAB_0161d3c2:
  auVar34 = ZEXT3264(auVar33);
  uVar15 = vmovmskps_avx(local_13a0);
  local_1338 = (Geometry *)~CONCAT44((int)((ulong)local_1338 >> 0x20),uVar15);
  puVar26 = puVar27;
  do {
    auVar33 = auVar34._0_32_;
    if (puVar26 == &local_fa0) goto LAB_0161d7bb;
    puVar27 = puVar26 + -2;
    puVar1 = puVar26 + -1;
    puVar26 = puVar27;
    if ((*puVar1 & (ulong)local_1338) != 0) {
      uVar22 = 1;
      uVar28 = *puVar27;
      do {
        puVar26 = puVar27;
        if ((uVar28 & 8) != 0) {
          if (uVar22 != 0) {
            local_1020._0_4_ = local_13a0._0_4_ ^ auVar53._0_4_;
            local_1020._4_4_ = local_13a0._4_4_ ^ auVar53._4_4_;
            local_1020._8_4_ = local_13a0._8_4_ ^ auVar53._8_4_;
            local_1020._12_4_ = local_13a0._12_4_ ^ auVar53._12_4_;
            local_1020._16_4_ = local_13a0._16_4_ ^ auVar53._16_4_;
            local_1020._20_4_ = local_13a0._20_4_ ^ auVar53._20_4_;
            local_1020._24_4_ = local_13a0._24_4_ ^ auVar53._24_4_;
            local_1020._28_4_ = local_13a0._28_4_ ^ auVar53._28_4_;
            lVar23 = 0;
            goto LAB_0161d5fe;
          }
          break;
        }
        auVar8._4_4_ = uStack_11fc;
        auVar8._0_4_ = local_1200;
        auVar8._8_4_ = uStack_11f8;
        auVar8._12_4_ = uStack_11f4;
        auVar11._4_4_ = fStack_11ec;
        auVar11._0_4_ = local_11f0;
        auVar11._8_4_ = fStack_11e8;
        auVar11._12_4_ = fStack_11e4;
        auVar8 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar28 + 0x20 + uVar17),auVar8,auVar11);
        auVar9 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar28 + 0x20 + uVar21),local_1220,
                                 local_1210);
        auVar8 = vpmaxsd_avx(auVar8,auVar9);
        auVar7._4_4_ = uStack_123c;
        auVar7._0_4_ = local_1240;
        auVar7._8_4_ = uStack_1238;
        auVar7._12_4_ = uStack_1234;
        auVar9 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar28 + 0x20 + uVar25),auVar7,local_1230);
        auVar10._4_4_ = uStack_12ac;
        auVar10._0_4_ = local_12b0;
        auVar10._8_4_ = uStack_12a8;
        auVar10._12_4_ = uStack_12a4;
        auVar9 = vpmaxsd_avx(auVar9,auVar10);
        auVar8 = vpmaxsd_avx(auVar8,auVar9);
        auVar9._4_4_ = uStack_125c;
        auVar9._0_4_ = local_1260;
        auVar9._8_4_ = uStack_1258;
        auVar9._12_4_ = uStack_1254;
        auVar6._4_4_ = fStack_124c;
        auVar6._0_4_ = local_1250;
        auVar6._8_4_ = fStack_1248;
        auVar6._12_4_ = fStack_1244;
        auVar9 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar28 + 0x20 + (uVar17 ^ 0x10)),auVar9,
                                 auVar6);
        auVar10 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar28 + 0x20 + (uVar21 ^ 0x10)),local_1280
                                  ,local_1270);
        auVar9 = vpminsd_avx(auVar9,auVar10);
        auVar10 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar28 + 0x20 + (uVar25 ^ 0x10)),local_12a0
                                  ,local_1290);
        auVar57._4_4_ = uStack_12bc;
        auVar57._0_4_ = local_12c0;
        auVar57._8_4_ = uStack_12b8;
        auVar57._12_4_ = uStack_12b4;
        auVar10 = vpminsd_avx(auVar10,auVar57);
        auVar9 = vpminsd_avx(auVar9,auVar10);
        auVar8 = vcmpps_avx(auVar8,auVar9,2);
        auVar34 = ZEXT1664(auVar8);
        uVar14 = vmovmskps_avx(auVar8);
        if (uVar14 == 0) break;
        uVar24 = (ulong)(uVar14 & 0xff);
        uVar22 = 0;
        uVar19 = 8;
        do {
          lVar23 = 0;
          for (uVar20 = uVar24; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
            lVar23 = lVar23 + 1;
          }
          uVar15 = *(undefined4 *)(uVar28 + 0x20 + lVar23 * 4);
          auVar30._4_4_ = uVar15;
          auVar30._0_4_ = uVar15;
          auVar30._8_4_ = uVar15;
          auVar30._12_4_ = uVar15;
          auVar30._16_4_ = uVar15;
          auVar30._20_4_ = uVar15;
          auVar30._24_4_ = uVar15;
          auVar30._28_4_ = uVar15;
          uVar15 = *(undefined4 *)(uVar28 + 0x40 + lVar23 * 4);
          auVar37._4_4_ = uVar15;
          auVar37._0_4_ = uVar15;
          auVar37._8_4_ = uVar15;
          auVar37._12_4_ = uVar15;
          auVar37._16_4_ = uVar15;
          auVar37._20_4_ = uVar15;
          auVar37._24_4_ = uVar15;
          auVar37._28_4_ = uVar15;
          auVar8 = vfmadd213ps_fma(auVar30,auVar54._0_32_,auVar51._0_32_);
          auVar9 = vfmadd213ps_fma(auVar37,auVar55._0_32_,auVar52._0_32_);
          uVar15 = *(undefined4 *)(uVar28 + 0x60 + lVar23 * 4);
          auVar40._4_4_ = uVar15;
          auVar40._0_4_ = uVar15;
          auVar40._8_4_ = uVar15;
          auVar40._12_4_ = uVar15;
          auVar40._16_4_ = uVar15;
          auVar40._20_4_ = uVar15;
          auVar40._24_4_ = uVar15;
          auVar40._28_4_ = uVar15;
          auVar13._4_4_ = fStack_fdc;
          auVar13._0_4_ = local_fe0;
          auVar13._8_4_ = fStack_fd8;
          auVar13._12_4_ = fStack_fd4;
          auVar13._16_4_ = fStack_fd0;
          auVar13._20_4_ = fStack_fcc;
          auVar13._24_4_ = fStack_fc8;
          auVar13._28_4_ = uStack_fc4;
          auVar10 = vfmadd213ps_fma(auVar40,auVar56._0_32_,auVar13);
          uVar15 = *(undefined4 *)(uVar28 + 0x30 + lVar23 * 4);
          auVar42._4_4_ = uVar15;
          auVar42._0_4_ = uVar15;
          auVar42._8_4_ = uVar15;
          auVar42._12_4_ = uVar15;
          auVar42._16_4_ = uVar15;
          auVar42._20_4_ = uVar15;
          auVar42._24_4_ = uVar15;
          auVar42._28_4_ = uVar15;
          auVar57 = vfmadd213ps_fma(auVar42,auVar54._0_32_,auVar51._0_32_);
          uVar15 = *(undefined4 *)(uVar28 + 0x50 + lVar23 * 4);
          auVar45._4_4_ = uVar15;
          auVar45._0_4_ = uVar15;
          auVar45._8_4_ = uVar15;
          auVar45._12_4_ = uVar15;
          auVar45._16_4_ = uVar15;
          auVar45._20_4_ = uVar15;
          auVar45._24_4_ = uVar15;
          auVar45._28_4_ = uVar15;
          uVar15 = *(undefined4 *)(uVar28 + 0x70 + lVar23 * 4);
          auVar47._4_4_ = uVar15;
          auVar47._0_4_ = uVar15;
          auVar47._8_4_ = uVar15;
          auVar47._12_4_ = uVar15;
          auVar47._16_4_ = uVar15;
          auVar47._20_4_ = uVar15;
          auVar47._24_4_ = uVar15;
          auVar47._28_4_ = uVar15;
          auVar6 = vfmadd213ps_fma(auVar45,auVar55._0_32_,auVar52._0_32_);
          auVar39 = vfmadd213ps_fma(auVar47,auVar56._0_32_,auVar13);
          auVar33 = vpminsd_avx2(ZEXT1632(auVar8),ZEXT1632(auVar57));
          auVar35 = vpminsd_avx2(ZEXT1632(auVar9),ZEXT1632(auVar6));
          auVar33 = vpmaxsd_avx2(auVar33,auVar35);
          auVar35 = vpminsd_avx2(ZEXT1632(auVar10),ZEXT1632(auVar39));
          auVar35 = vpmaxsd_avx2(auVar35,local_1320);
          auVar33 = vpmaxsd_avx2(auVar33,auVar35);
          auVar35 = vpmaxsd_avx2(ZEXT1632(auVar8),ZEXT1632(auVar57));
          auVar36 = vpmaxsd_avx2(ZEXT1632(auVar9),ZEXT1632(auVar6));
          auVar36 = vpminsd_avx2(auVar35,auVar36);
          auVar35 = vpmaxsd_avx2(ZEXT1632(auVar10),ZEXT1632(auVar39));
          auVar35 = vpminsd_avx2(auVar35,local_1300);
          auVar35 = vpminsd_avx2(auVar36,auVar35);
          auVar33 = vcmpps_avx(auVar33,auVar35,2);
          auVar34 = ZEXT3264(auVar33);
          uVar20 = uVar19;
          if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar33 >> 0x7f,0) != '\0') ||
                (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar33 >> 0xbf,0) != '\0') ||
              (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar33[0x1f] < '\0') {
            uVar20 = *(ulong *)(uVar28 + lVar23 * 8);
            if (uVar19 != 8) {
              *puVar27 = uVar19;
              puVar27[1] = uVar22;
              puVar27 = puVar27 + 2;
            }
            uVar14 = vmovmskps_avx(auVar33);
            uVar22 = (ulong)uVar14;
          }
          uVar24 = uVar24 - 1 & uVar24;
          uVar19 = uVar20;
        } while (uVar24 != 0);
        puVar26 = puVar27;
        uVar28 = uVar20;
      } while (uVar20 != 8);
    }
  } while( true );
  while( true ) {
    local_1368.geomID = *(uint *)((uVar28 & 0xfffffffffffffff0) + lVar23 * 8);
    local_1338 = (context->scene->geometries).items[local_1368.geomID].ptr;
    uVar14 = local_1338->mask;
    auVar31._4_4_ = uVar14;
    auVar31._0_4_ = uVar14;
    auVar31._8_4_ = uVar14;
    auVar31._12_4_ = uVar14;
    auVar31._16_4_ = uVar14;
    auVar31._20_4_ = uVar14;
    auVar31._24_4_ = uVar14;
    auVar31._28_4_ = uVar14;
    auVar33 = vpand_avx2(auVar31,*(undefined1 (*) [32])(ray + 0x120));
    auVar35 = vpcmpeqd_avx2(auVar59._0_32_,auVar33);
    auVar33 = local_1020 & ~auVar35;
    auVar5._8_8_ = uStack_ff8;
    auVar5._0_8_ = local_1000;
    auVar5._16_8_ = uStack_ff0;
    auVar5._24_8_ = uStack_fe8;
    if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar33 >> 0x7f,0) != '\0') ||
          (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar33 >> 0xbf,0) != '\0') ||
        (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar33[0x1f] < '\0')
    {
      local_fc0 = vandnps_avx(auVar35,local_1020);
      local_1368.primID = *(uint *)((uVar28 & 0xfffffffffffffff0) + 4 + lVar23 * 8);
      local_1368.valid = (int *)local_fc0;
      local_1368.geometryUserPtr = local_1338->userPtr;
      local_1368.context = context->user;
      local_1368.N = 8;
      local_1330 = 0;
      local_1328 = context->args;
      p_Var16 = local_1328->intersect;
      if (p_Var16 == (RTCIntersectFunctionN)0x0) {
        p_Var16 = (RTCIntersectFunctionN)
                  local_1338[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      }
      auVar33 = ZEXT1632(auVar53._0_16_);
      local_1368.rayhit = (RTCRayHitN *)ray;
      local_1338 = (Geometry *)(*p_Var16)(&local_1368);
      auVar59 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar5 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(ZEXT816(0) << 0x40),1);
      auVar33 = vpcmpeqd_avx2(auVar33,auVar33);
      auVar53 = ZEXT3264(auVar33);
      auVar54 = ZEXT3264(local_1040);
      auVar55 = ZEXT3264(local_1060);
      auVar56 = ZEXT3264(local_1080);
      auVar51 = ZEXT3264(CONCAT428(uStack_1164,
                                   CONCAT424(fStack_1168,
                                             CONCAT420(fStack_116c,
                                                       CONCAT416(fStack_1170,
                                                                 CONCAT412(fStack_1174,
                                                                           CONCAT48(fStack_1178,
                                                                                    CONCAT44(
                                                  fStack_117c,local_1180))))))));
      auVar52 = ZEXT3264(CONCAT428(uStack_1184,
                                   CONCAT424(fStack_1188,
                                             CONCAT420(fStack_118c,
                                                       CONCAT416(fStack_1190,
                                                                 CONCAT412(fStack_1194,
                                                                           CONCAT48(fStack_1198,
                                                                                    CONCAT44(
                                                  fStack_119c,local_11a0))))))));
    }
    auVar33 = vandnps_avx(auVar5,local_1020);
    lVar23 = lVar23 + 1;
    auVar35 = local_1020 & ~auVar5;
    local_1020 = auVar33;
    if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar35 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar35 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar35 >> 0x7f,0) == '\0') &&
          (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar35 >> 0xbf,0) == '\0') &&
        (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar35[0x1f])
    break;
LAB_0161d5fe:
    auVar33 = local_1020;
    if ((ulong)((uint)uVar28 & 0xf) - 8 == lVar23) break;
  }
  auVar32._0_4_ = auVar53._0_4_ ^ auVar33._0_4_;
  auVar32._4_4_ = auVar53._4_4_ ^ auVar33._4_4_;
  auVar32._8_4_ = auVar53._8_4_ ^ auVar33._8_4_;
  auVar32._12_4_ = auVar53._12_4_ ^ auVar33._12_4_;
  auVar32._16_4_ = auVar53._16_4_ ^ auVar33._16_4_;
  auVar32._20_4_ = auVar53._20_4_ ^ auVar33._20_4_;
  auVar32._24_4_ = auVar53._24_4_ ^ auVar33._24_4_;
  auVar32._28_4_ = auVar53._28_4_ ^ auVar33._28_4_;
  local_13a0 = vorps_avx(local_13a0,auVar32);
  auVar35 = local_11c0 & ~local_13a0;
  auVar33 = local_11c0;
  if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar35 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar35 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar35 >> 0x7f,0) == '\0') &&
        (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar35 >> 0xbf,0) == '\0') &&
      (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar35[0x1f])
  goto LAB_0161d7bb;
  local_11c0 = vandnps_avx(local_13a0,local_11c0);
  auVar33._8_4_ = 0xff800000;
  auVar33._0_8_ = 0xff800000ff800000;
  auVar33._12_4_ = 0xff800000;
  auVar33._16_4_ = 0xff800000;
  auVar33._20_4_ = 0xff800000;
  auVar33._24_4_ = 0xff800000;
  auVar33._28_4_ = 0xff800000;
  local_1300 = vblendvps_avx(local_1300,auVar33,local_13a0);
  goto LAB_0161d3c2;
LAB_0161d7bb:
  if (uVar18 == 0) {
    auVar33 = vpcmpeqd_avx2(auVar33,auVar33);
    auVar33 = vpcmpeqd_avx2(auVar33,(undefined1  [32])local_1140);
    auVar33 = vpand_avx2(auVar33,local_13a0);
    auVar38._8_4_ = 0xff800000;
    auVar38._0_8_ = 0xff800000ff800000;
    auVar38._12_4_ = 0xff800000;
    auVar38._16_4_ = 0xff800000;
    auVar38._20_4_ = 0xff800000;
    auVar38._24_4_ = 0xff800000;
    auVar38._28_4_ = 0xff800000;
    auVar33 = vmaskmovps_avx(auVar33,auVar38);
    *(undefined1 (*) [32])(ray + 0x100) = auVar33;
    return;
  }
  goto LAB_0161cf81;
}

Assistant:

static __forceinline vboolf8 operator ==(const vint8& a, const vint8& b) { return _mm256_castsi256_ps(_mm256_cmpeq_epi32(a, b)); }